

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_recvmsg(nng_socket s,nng_msg **msgp,int flags)

{
  nng_err nVar1;
  nni_msg *pnVar2;
  undefined1 local_1f0 [8];
  nni_aio aio;
  nni_sock *sock;
  
  nVar1 = nni_sock_find((nni_sock **)&aio.a_reap_node,s.id);
  if (nVar1 == NNG_OK) {
    nni_aio_init((nni_aio *)local_1f0,(nni_cb)0x0,(void *)0x0);
    nni_aio_set_timeout((nni_aio *)local_1f0,(flags & 2U) - 2);
    nni_sock_recv((nni_sock *)aio.a_reap_node.rn_next,(nni_aio *)local_1f0);
    nni_sock_rele((nni_sock *)aio.a_reap_node.rn_next);
    nni_aio_wait((nni_aio *)local_1f0);
    nVar1 = nni_aio_result((nni_aio *)local_1f0);
    if (nVar1 == NNG_ETIMEDOUT) {
      nVar1 = ((flags & 2U) >> 1) * 3 + NNG_ETIMEDOUT;
    }
    else if (nVar1 == NNG_OK) {
      pnVar2 = nni_aio_get_msg((nni_aio *)local_1f0);
      *msgp = pnVar2;
      nVar1 = NNG_OK;
    }
    nni_aio_fini((nni_aio *)local_1f0);
  }
  return nVar1;
}

Assistant:

int
nng_recvmsg(nng_socket s, nng_msg **msgp, int flags)
{
	int       rv;
	nni_sock *sock;
	nni_aio   aio;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_aio_init(&aio, NULL, NULL);
	if (flags & NNG_FLAG_NONBLOCK) {
		nng_aio_set_timeout(&aio, NNG_DURATION_ZERO);
	} else {
		nng_aio_set_timeout(&aio, NNG_DURATION_DEFAULT);
	}
	nni_sock_recv(sock, &aio);
	nni_sock_rele(sock);

	nni_aio_wait(&aio);

	if ((rv = nni_aio_result(&aio)) == 0) {
		*msgp = nng_aio_get_msg(&aio);

	} else if ((rv == NNG_ETIMEDOUT) &&
	    ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK)) {
		rv = NNG_EAGAIN;
	}
	nni_aio_fini(&aio);

	return (rv);
}